

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O0

void __thiscall CEffects::PlayerSpawn(CEffects *this,vec2 Pos)

{
  vec2 in_RDI;
  long in_FS_OFFSET;
  float fVar1;
  undefined8 in_XMM0_Qa;
  int i;
  CParticle p;
  undefined8 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  float v;
  vec2 Pos_00;
  vector4_base<float> local_80;
  vec2 local_70;
  vector2_base<float> local_68;
  undefined8 local_60;
  vector2_base<float> local_58;
  undefined4 local_50;
  float local_48;
  float local_44;
  undefined4 local_40;
  float local_3c;
  float local_38;
  float local_34;
  undefined4 local_30;
  vector4_base<float> local_2c;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Pos_00 = in_RDI;
  local_10 = in_XMM0_Qa;
  for (v = 0.0; (int)v < 0x20; v = (float)((int)v + 1)) {
    in_stack_ffffffffffffff58 = &local_60;
    CParticle::CParticle((CParticle *)in_RDI);
    CParticle::SetDefault((CParticle *)in_RDI);
    local_50 = 6;
    local_60 = local_10;
    local_70 = RandomDir();
    fVar1 = random_float();
    powf(fVar1,3.0);
    local_68 = vector2_base<float>::operator*((vector2_base<float> *)Pos_00,v);
    local_58 = local_68;
    fVar1 = random_float();
    local_48 = fVar1 * 0.3 + 0.3;
    fVar1 = random_float();
    local_44 = fVar1 * 32.0 + 64.0;
    local_40 = 0;
    fVar1 = random_float();
    local_3c = fVar1 * 3.1415927 * 2.0;
    local_38 = random_float();
    local_34 = random_float();
    local_34 = local_34 * -400.0;
    local_30 = 0x3f333333;
    vector4_base<float>::vector4_base(&local_80,0.70980394,0.3137255,0.79607844,1.0);
    local_2c.field_0 = local_80.field_0;
    local_2c.field_1 = local_80.field_1;
    local_2c.field_2 = local_80.field_2;
    local_2c.field_3 = local_80.field_3;
    CParticles::Add((CParticles *)Pos_00,(int)v,(CParticle *)in_RDI);
  }
  CSounds::PlayAt((CSounds *)CONCAT44(v,in_stack_ffffffffffffff68),(int)in_RDI.field_1,
                  (int)in_RDI.field_0,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20),Pos_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::PlayerSpawn(vec2 Pos)
{
	for(int i = 0; i < 32; i++)
	{
		CParticle p;
		p.SetDefault();
		p.m_Spr = SPRITE_PART_SHELL;
		p.m_Pos = Pos;
		p.m_Vel = RandomDir() * (powf(random_float(), 3)*600.0f);
		p.m_LifeSpan = 0.3f + random_float()*0.3f;
		p.m_StartSize = 64.0f + random_float()*32;
		p.m_EndSize = 0;
		p.m_Rot = random_float()*pi*2;
		p.m_Rotspeed = random_float();
		p.m_Gravity = random_float()*-400.0f;
		p.m_Friction = 0.7f;
		p.m_Color = vec4(0xb5/255.0f, 0x50/255.0f, 0xcb/255.0f, 1.0f);
		m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);

	}
	m_pClient->m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_SPAWN, 1.0f, Pos);
}